

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O2

cf_hashtbl_iter_t cf_hashtbl_iter_next(cf_hashtbl_iter_t it)

{
  cf_hashtbl_iter_t phVar1;
  uint uVar2;
  
  phVar1 = it->next;
  if (phVar1 == (cf_hashtbl_iter_t)0x0) {
    uVar2 = it->hash;
    do {
      uVar2 = uVar2 + 1;
      if (it->tbl->hashmsk < uVar2) {
        return (cf_hashtbl_iter_t)0x0;
      }
      phVar1 = it->tbl->table[uVar2];
    } while (phVar1 == (cf_hashtbl_iter_t)0x0);
  }
  return phVar1;
}

Assistant:

cf_hashtbl_iter_t cf_hashtbl_iter_next(cf_hashtbl_iter_t it) {
    cf_hashtbl_t* self = it->tbl;

    /* the next index */
    cf_uint32_t i = it->hash + 1;
    if (it->next) {
        return it->next;
    }
    while (i <= self->hashmsk) {
        if (self->table[i]) {
            return self->table[i];
        }
        i++;
    }
    return CF_NULL_PTR;
}